

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O2

sx__job * sx__new_job(sx_job_context *ctx,int index,sx_job_cb *callback,void *user,int range_start,
                     int range_end,sx_job_t counter,uint32_t tags,sx_job_priority priority)

{
  code *pcVar1;
  _Bool _Var2;
  sx__job *psVar3;
  sx_fiber_t pvVar4;
  void *pvVar5;
  sx_fiber_stack stack;
  
  psVar3 = (sx__job *)sx_pool_new(ctx->job_pool);
  if (psVar3 == (sx__job *)0x0) {
    psVar3 = (sx__job *)0x0;
  }
  else {
    psVar3->job_index = index;
    psVar3->tags = tags;
    psVar3->done = 0;
    psVar3->owner_tid = 0;
    pvVar5 = (psVar3->stack_mem).sptr;
    if (pvVar5 == (void *)0x0) {
      _Var2 = sx_fiber_stack_init(&psVar3->stack_mem,ctx->stack_sz);
      if (!_Var2) {
        sx__mem_run_fail_callback
                  ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",0x81);
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                          ,0x81,"Out of memory");
        pcVar1 = (code *)swi(3);
        psVar3 = (sx__job *)(*pcVar1)();
        return psVar3;
      }
      pvVar5 = (psVar3->stack_mem).sptr;
    }
    stack.ssize = (psVar3->stack_mem).ssize;
    stack.sptr = pvVar5;
    stack._12_4_ = 0;
    pvVar4 = sx_fiber_create(stack,fiber_fn);
    psVar3->fiber = pvVar4;
    psVar3->counter = counter;
    psVar3->wait_counter = &ctx->dummy_counter;
    psVar3->ctx = ctx;
    psVar3->callback = callback;
    psVar3->user = user;
    psVar3->range_start = range_start;
    psVar3->range_end = range_end;
    psVar3->priority = priority;
    psVar3->next = (sx__job *)0x0;
    psVar3->prev = (sx__job *)0x0;
  }
  return psVar3;
}

Assistant:

static sx__job* sx__new_job(sx_job_context* ctx, int index, sx_job_cb* callback, void* user,
                            int range_start, int range_end, sx_job_t counter, uint32_t tags,
                            sx_job_priority priority)
{
    sx__job* j = (sx__job*)sx_pool_new(ctx->job_pool);

    if (j) {
        j->job_index = index;
        j->owner_tid = 0;
        j->tags = tags;
        j->done = 0;
        if (!j->stack_mem.sptr) {
            // Initialize stack memory
            if (!sx_fiber_stack_init(&j->stack_mem, ctx->stack_sz)) {
                sx_out_of_memory();
                return NULL;
            }
        }
        j->fiber = sx_fiber_create(j->stack_mem, fiber_fn);
        j->counter = counter;
        j->wait_counter = &ctx->dummy_counter;
        j->ctx = ctx;
        j->callback = callback;
        j->user = user;
        j->range_start = range_start;
        j->range_end = range_end;
        j->priority = priority;
        j->next = j->prev = NULL;
    }
    return j;
}